

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

shared_ptr<httplib::Response> __thiscall
httplib::Client::Post(Client *this,char *path,Headers *headers,string *body,char *content_type)

{
  undefined8 uVar1;
  char cVar2;
  socket_t sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<httplib::Response> sVar4;
  Request req;
  char *local_1a8;
  undefined1 local_1a0 [136];
  _Rb_tree_node_base local_118;
  size_t local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Rb_tree_node_base local_c8;
  size_t local_a8;
  _Rb_tree_node_base local_98;
  size_t local_78;
  pointer psStack_70;
  pointer local_68;
  pointer psStack_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  _Any_data _Stack_50;
  _Manager_type p_Stack_40;
  _Invoker_type local_38;
  
  local_1a0._0_8_ = local_1a0 + 0x10;
  local_1a0._8_8_ = 0;
  local_1a0[0x10] = '\0';
  local_1a0._32_8_ = local_1a0 + 0x30;
  local_1a0._40_8_ = 0;
  local_1a0[0x30] = '\0';
  local_1a0._64_8_ = local_1a0 + 0x50;
  local_1a0._72_8_ = 0;
  local_1a0[0x50] = '\0';
  local_1a0._96_8_ = local_1a0 + 0x70;
  local_1a0._104_8_ = (char *)0x0;
  local_1a0[0x70] = '\0';
  local_118._M_left = &local_118;
  local_118._M_color = _S_red;
  local_118._M_parent = (_Base_ptr)0x0;
  local_f8 = 0;
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_c8._M_left = &local_c8;
  local_c8._M_color = _S_red;
  local_c8._M_parent = (_Base_ptr)0x0;
  local_a8 = 0;
  local_98._M_left = &local_98;
  local_98._M_color = _S_red;
  local_98._M_parent = (_Base_ptr)0x0;
  local_38 = (_Invoker_type)0x0;
  _Stack_50._8_8_ = 0;
  p_Stack_40 = (_Manager_type)0x0;
  local_58._M_current = (char *)0x0;
  _Stack_50._M_unused._M_object = (void *)0x0;
  local_68 = (pointer)0x0;
  psStack_60 = (pointer)0x0;
  local_78 = 0;
  psStack_70 = (pointer)0x0;
  local_118._M_right = local_118._M_left;
  local_c8._M_right = local_c8._M_left;
  local_98._M_right = local_98._M_left;
  std::__cxx11::string::_M_replace((ulong)(local_1a0 + 0x20),0,(char *)0x0,0x15c510);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_1a0 + 0x80),
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)body);
  uVar1 = local_1a0._104_8_;
  strlen((char *)headers);
  std::__cxx11::string::_M_replace((ulong)(local_1a0 + 0x60),0,(char *)uVar1,(ulong)headers);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const(&)[13],char_const*&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)(local_1a0 + 0x80),(char (*) [13])"Content-Type",&local_1a8);
  std::__cxx11::string::_M_assign((string *)&local_f0);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa8);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016f488;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)(this_00 + 2);
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  *(undefined1 *)&this_00[2]._vptr__Sp_counted_base = 0;
  *(undefined4 *)&this_00[3]._vptr__Sp_counted_base = 0xffffffff;
  *(undefined4 *)&this_00[4]._vptr__Sp_counted_base = 0;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)(this_00 + 4);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this_00[5]._M_use_count = this_00 + 4;
  this_00[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Atomic_word **)&this_00[6]._M_use_count = &this_00[7]._M_use_count;
  this_00[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&this_00[7]._M_use_count = 0;
  this_00[8]._M_use_count = 0;
  this_00[8]._M_weak_count = 0;
  this_00[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[9]._M_use_count = 0;
  this_00[9]._M_weak_count = 0;
  this_00[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  if ((char *)local_1a0._104_8_ != (char *)0x0) {
    sVar3 = detail::
            create_socket<httplib::Client::create_client_socket()const::_lambda(int,addrinfo&)_1_>
                      (*(char **)(path + 8),*(int *)(path + 0x28),(anon_class_8_1_8991fb9c)path,0);
    if (sVar3 != -1) {
      cVar2 = (**(code **)(*(long *)path + 0x18))(path,sVar3,local_1a0,this_00 + 1);
      if (cVar2 != '\0') {
        this->_vptr_Client = (_func_int **)(this_00 + 1);
        (this->host_)._M_dataplus._M_p = (pointer)this_00;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        goto LAB_00142612;
      }
    }
  }
  this->_vptr_Client = (_func_int **)0x0;
  (this->host_)._M_dataplus._M_p = (pointer)0x0;
LAB_00142612:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  Request::~Request((Request *)local_1a0);
  sVar4.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<httplib::Response>)
         sVar4.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Response> Client::Post(
    const char* path, const Headers& headers, const std::string& body, const char* content_type)
{
    Request req;
    req.method = "POST";
    req.headers = headers;
    req.path = path;

    req.headers.emplace("Content-Type", content_type);
    req.body = body;

    auto res = std::make_shared<Response>();

    return send(req, *res) ? res : nullptr;
}